

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O3

REF_STATUS ref_metric_truncated_cone_dist(REF_DBL *cone_geom,REF_DBL *p,REF_DBL *dist)

{
  undefined1 auVar1 [16];
  REF_DBL RVar2;
  uint uVar3;
  REF_DBL *pRVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined4 uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  double dVar16;
  REF_DBL u [3];
  REF_DBL pa [3];
  REF_DBL a [3];
  REF_DBL ba [3];
  REF_DBL b [3];
  double local_f8 [4];
  double local_d8 [4];
  REF_DBL local_b8 [4];
  double local_98;
  undefined1 local_88 [16];
  double local_78 [4];
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  REF_DBL local_38 [3];
  
  auVar10 = *(undefined1 (*) [16])(cone_geom + 6);
  auVar8._0_8_ = auVar10._0_8_ ^ 0x8000000000000000;
  auVar8._8_8_ = auVar10._8_8_ ^ 0x8000000000000000;
  local_88 = maxpd(auVar10,auVar8);
  dVar6 = local_88._8_8_;
  if (dVar6 <= local_88._0_8_) {
    local_b8[2] = cone_geom[2];
    local_b8[0] = *cone_geom;
    local_b8[1] = cone_geom[1];
    pRVar4 = cone_geom + 3;
  }
  else {
    local_b8[2] = cone_geom[5];
    local_b8[0] = cone_geom[3];
    local_b8[1] = cone_geom[4];
    local_88._8_8_ = local_88._0_8_;
    local_88._0_8_ = dVar6;
    pRVar4 = cone_geom;
  }
  local_38[2] = pRVar4[2];
  local_38[0] = *pRVar4;
  local_38[1] = pRVar4[1];
  lVar5 = 0;
  do {
    dVar6 = *(double *)((long)local_38 + lVar5) - *(double *)((long)local_b8 + lVar5);
    *(double *)((long)local_78 + lVar5) = dVar6;
    *(double *)((long)local_f8 + lVar5) = dVar6;
    *(double *)((long)local_d8 + lVar5) =
         *(double *)((long)p + lVar5) - *(double *)((long)local_b8 + lVar5);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x18);
  local_98 = SQRT(local_78[2] * local_78[2] + local_78[0] * local_78[0] + local_78[1] * local_78[1])
  ;
  auVar9._0_8_ = local_98 * 1e+20;
  auVar9._8_8_ = local_f8[0];
  auVar10._8_4_ = SUB84(local_f8[0],0);
  auVar10._0_8_ = -auVar9._0_8_;
  auVar10._12_4_ = (uint)((ulong)local_f8[0] >> 0x20) ^ 0x80000000;
  auVar10 = maxpd(auVar9,auVar10);
  dVar6 = auVar10._0_8_;
  if (dVar6 <= auVar10._8_8_) {
LAB_001cdce6:
    dVar6 = local_88._0_8_;
    if (local_88._0_8_ <= local_88._8_8_) {
      dVar6 = local_88._8_8_;
    }
    dVar6 = SQRT(local_d8[2] * local_d8[2] + local_d8[0] * local_d8[0] + local_d8[1] * local_d8[1])
            - dVar6;
    RVar2 = 0.0;
    if (0.0 <= dVar6) {
      RVar2 = dVar6;
    }
    *dist = RVar2;
    return 0;
  }
  uVar11 = (undefined4)((ulong)local_f8[1] >> 0x20);
  if (local_f8[1] <= -local_f8[1]) {
    uVar11 = (undefined4)((ulong)-local_f8[1] >> 0x20);
  }
  if (dVar6 < (double)CONCAT44(uVar11,SUB84(local_f8[1],0)) ||
      dVar6 == (double)CONCAT44(uVar11,SUB84(local_f8[1],0))) goto LAB_001cdce6;
  uVar11 = (undefined4)((ulong)local_f8[2] >> 0x20);
  if (local_f8[2] <= -local_f8[2]) {
    uVar11 = (undefined4)((ulong)-local_f8[2] >> 0x20);
  }
  if (dVar6 < (double)CONCAT44(uVar11,SUB84(local_f8[2],0)) ||
      dVar6 == (double)CONCAT44(uVar11,SUB84(local_f8[2],0))) goto LAB_001cdce6;
  uVar3 = ref_math_normalize(local_f8);
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0xcc3,
           "ref_metric_truncated_cone_dist",(ulong)uVar3,"axis length zero");
    ref_metric_tattle_truncated_cone_dist(cone_geom,p);
    return uVar3;
  }
  dVar6 = local_f8[2] * local_d8[2] + local_f8[0] * local_d8[0] + local_f8[1] * local_d8[1];
  dVar13 = SQRT(local_d8[2] * local_d8[2] + local_d8[0] * local_d8[0] + local_d8[1] * local_d8[1]);
  dVar16 = dVar6 * dVar6;
  dVar13 = dVar13 * dVar13 - dVar16;
  dVar7 = 0.0;
  if (0.0 < dVar13) {
    if (dVar13 < 0.0) {
      uStack_40 = 0;
      uStack_50 = 0;
      local_d8[3] = dVar13;
      local_58 = dVar16;
      local_48 = dVar6;
      dVar7 = sqrt(dVar13);
      dVar6 = local_48;
      dVar16 = local_58;
      dVar13 = local_d8[3];
    }
    else {
      dVar7 = SQRT(dVar13);
    }
  }
  if (0.0 <= dVar6) {
    if (dVar13 < (double)local_88._8_8_ * (double)local_88._8_8_) {
      if (local_98 < dVar6) {
        *dist = dVar6 - local_98;
        return 0;
      }
      *dist = 0.0;
      return 0;
    }
    dVar12 = (double)local_88._0_8_ - (double)local_88._8_8_;
    dVar13 = SQRT(local_98 * local_98 + dVar12 * dVar12);
    auVar15._0_8_ = dVar13 * 1e+20;
    auVar15._8_8_ = dVar12;
    auVar1._8_8_ = -dVar12;
    auVar1._0_8_ = -auVar15._0_8_;
    auVar10 = maxpd(auVar15,auVar1);
    if (auVar10._0_8_ <= auVar10._8_8_) {
LAB_001cdf4d:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0xce4,"ref_metric_truncated_cone_dist","div zero forming i and j");
      ref_metric_tattle_truncated_cone_dist(cone_geom,p);
      return 1;
    }
    dVar14 = local_98;
    if (local_98 <= -local_98) {
      dVar14 = -local_98;
    }
    if (auVar10._0_8_ <= dVar14) goto LAB_001cdf4d;
    dVar14 = dVar6 * (local_98 / dVar13) - (dVar12 / dVar13) * (dVar7 - (double)local_88._0_8_);
    if (0.0 < dVar14) {
      dVar6 = dVar6 * (dVar12 / dVar13) + (local_98 / dVar13) * (dVar7 - (double)local_88._0_8_);
      if (dVar13 <= dVar14) {
        dVar16 = SQRT(dVar6 * dVar6 + (dVar14 - dVar13) * (dVar14 - dVar13));
      }
      else {
        dVar16 = 0.0;
        if (0.0 <= dVar6) {
          dVar16 = dVar6;
        }
      }
      goto LAB_001cde82;
    }
  }
  else if (dVar13 < (double)local_88._0_8_ * (double)local_88._0_8_) {
    *dist = -dVar6;
    return 0;
  }
  dVar16 = SQRT((dVar7 - (double)local_88._0_8_) * (dVar7 - (double)local_88._0_8_) + dVar16);
LAB_001cde82:
  *dist = dVar16;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_metric_truncated_cone_dist(REF_DBL *cone_geom,
                                                  REF_DBL *p, REF_DBL *dist) {
  REF_INT d;
  REF_DBL a[3], b[3], ba[3], u[3], pa[3], l, x, y, y2, n, ra, rb, delta, s;
  REF_DBL xprime, yprime;
  REF_BOOL verbose = REF_FALSE;
  if (verbose) printf("\np %f %f %f\n", p[0], p[1], p[2]);
  if (ABS(cone_geom[6]) >= ABS(cone_geom[7])) {
    ra = ABS(cone_geom[6]);
    rb = ABS(cone_geom[7]);
    for (d = 0; d < 3; d++) {
      a[d] = cone_geom[d];
      b[d] = cone_geom[d + 3];
    }
    if (verbose) printf("forward ra %f rb %f\n", ra, rb);
  } else {
    ra = ABS(cone_geom[7]);
    rb = ABS(cone_geom[6]);
    for (d = 0; d < 3; d++) {
      a[d] = cone_geom[d + 3];
      b[d] = cone_geom[d];
    }
    if (verbose) printf("reverse ra %f rb %f\n", ra, rb);
  }
  if (verbose) printf("a %f %f %f\n", a[0], a[1], a[2]);
  if (verbose) printf("b %f %f %f\n", b[0], b[1], b[2]);
  for (d = 0; d < 3; d++) {
    ba[d] = b[d] - a[d];
    u[d] = ba[d];
    pa[d] = p[d] - a[d]; /* direction flip, error in paper? */
  }
  l = sqrt(ref_math_dot(ba, ba));
  if (!ref_math_divisible(u[0], l) || !ref_math_divisible(u[1], l) ||
      !ref_math_divisible(u[2], l)) { /* assume sphere */
    REF_DBL r;
    r = sqrt(pa[0] * pa[0] + pa[1] * pa[1] + pa[2] * pa[2]);
    *dist = MAX(0, r - MAX(ra, rb));
    return REF_SUCCESS;
  }
  RSB(ref_math_normalize(u), "axis length zero",
      { ref_metric_tattle_truncated_cone_dist(cone_geom, p); });
  x = ref_math_dot(pa, u); /* sign flip, error in paper? */
  n = sqrt(ref_math_dot(pa, pa));
  y2 = n * n - x * x;
  if (verbose) printf("n2 %f x2 %f y2 %f\n", n * n, x * x, y2);
  if (y2 <= 0) {
    y = 0;
  } else {
    y = sqrt(y2);
  }
  if (verbose) printf("x %f y %f l %f\n", x, y, l);
  if (x < 0) {
    if (y2 < ra * ra) {
      *dist = -x;
      return REF_SUCCESS;
    } else {
      *dist = sqrt((y - ra) * (y - ra) + x * x);
      return REF_SUCCESS;
    }
  }
  if (y2 < rb * rb) {
    if (x > l) {
      *dist = x - l;
      return REF_SUCCESS;
    } else {
      *dist = 0;
      return REF_SUCCESS;
    }
  }
  delta = ra - rb;
  s = sqrt(l * l + delta * delta);
  RAB(ref_math_divisible(delta, s) && ref_math_divisible(l, s),
      "div zero forming i and j",
      { ref_metric_tattle_truncated_cone_dist(cone_geom, p); });
  if (verbose) printf("l/s %f delta/s %f\n", l / s, delta / s);
  xprime = x * (l / s) - (y - ra) * (delta / s);
  yprime = x * (delta / s) + (y - ra) * (l / s);
  if (verbose) printf("xprime %f yprime %f\n", xprime, yprime);
  if (xprime <= 0) {
    *dist = sqrt((y - ra) * (y - ra) + x * x);
    return REF_SUCCESS;
  }
  if (xprime >= s) {
    *dist = sqrt(yprime * yprime + (xprime - s) * (xprime - s));
    return REF_SUCCESS;
  }
  *dist = MAX(0, yprime);
  return REF_SUCCESS;
}